

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  Table *pTVar6;
  Column *pCVar7;
  Expr *pEVar8;
  Expr *pEVar9;
  RenameToken *pRVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  Column *local_60;
  
  pTVar6 = pParse->pNewTable;
  if (pTVar6 == (Table *)0x0) goto LAB_00173c07;
  if ((pTVar6->tabFlags & 4) != 0) {
    sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar6->zName);
    goto LAB_00173c07;
  }
  pTVar6->tabFlags = pTVar6->tabFlags | 4;
  if (pList == (ExprList *)0x0) {
    uVar12 = (long)pTVar6->nCol - 1;
    pCVar7 = pTVar6->aCol;
    local_60 = pCVar7 + uVar12;
    uVar4 = pCVar7[uVar12].colFlags;
    pCVar7[uVar12].colFlags = uVar4 | 1;
    bVar14 = true;
    if ((uVar4 & 0x60) != 0) {
      sqlite3ErrorMsg(pParse,"generated columns cannot be part of the PRIMARY KEY");
    }
  }
  else {
    iVar5 = pList->nExpr;
    if (0 < (long)iVar5) {
      uVar12 = 0xffffffff;
      lVar11 = 0;
      local_60 = (Column *)0x0;
LAB_001739ae:
      for (pEVar9 = pList->a[lVar11].pExpr;
          (pEVar9 != (Expr *)0x0 && ((pEVar9->flags & 0x2000) != 0)); pEVar9 = pEVar9->pLeft) {
      }
      pEVar8 = pEVar9;
      if ((pEVar9->op == 'u') ||
         ((pEVar9->op == 'q' && (pEVar8 = pEVar9->pLeft, pEVar8->op == 'u')))) {
        pEVar8->op = ';';
      }
      if (pEVar9->op == ';') {
        sVar3 = pTVar6->nCol;
        if (0 < sVar3) {
          uVar12 = 0;
LAB_00173a05:
          pCVar7 = pTVar6->aCol + uVar12;
          lVar13 = 0;
          do {
            bVar1 = (pEVar9->u).zToken[lVar13];
            bVar2 = pTVar6->aCol[uVar12].zCnName[lVar13];
            if (bVar1 == bVar2) {
              if ((ulong)bVar1 == 0) goto LAB_00173a3c;
            }
            else if (""[bVar1] != ""[bVar2]) goto LAB_00173a3c;
            lVar13 = lVar13 + 1;
          } while( true );
        }
        uVar12 = 0;
      }
      goto LAB_00173a84;
    }
    bVar14 = false;
    uVar12 = 0xffffffff;
    local_60 = (Column *)0x0;
  }
  goto LAB_00173b16;
LAB_00173a3c:
  if (bVar1 == bVar2) {
    uVar4 = pCVar7->colFlags;
    pCVar7->colFlags = uVar4 | 1;
    local_60 = pCVar7;
    if ((uVar4 & 0x60) != 0) {
      sqlite3ErrorMsg(pParse,"generated columns cannot be part of the PRIMARY KEY");
    }
    goto LAB_00173a84;
  }
  uVar12 = uVar12 + 1;
  if (uVar12 == (long)(int)sVar3) goto code_r0x00173a49;
  goto LAB_00173a05;
code_r0x00173a49:
  uVar12 = (ulong)(uint)(int)sVar3;
LAB_00173a84:
  lVar11 = lVar11 + 1;
  if (lVar11 == iVar5) goto code_r0x00173a90;
  goto LAB_001739ae;
code_r0x00173a90:
  bVar14 = iVar5 == 1;
LAB_00173b16:
  if ((((bVar14) && (local_60 != (Column *)0x0)) && (sortOrder != 1)) &&
     ((local_60->field_0x8 & 0xf0) == 0x40)) {
    if ((pList != (ExprList *)0x0) && (1 < pParse->eParseMode)) {
      for (pEVar9 = pList->a[0].pExpr; (pEVar9 != (Expr *)0x0 && ((pEVar9->flags & 0x2000) != 0));
          pEVar9 = pEVar9->pLeft) {
      }
      pRVar10 = pParse->pRename;
      if (pRVar10 != (RenameToken *)0x0) {
        do {
          if ((Expr *)pRVar10->p == pEVar9) {
            pRVar10->p = &pTVar6->iPKey;
            break;
          }
          pRVar10 = pRVar10->pNext;
        } while (pRVar10 != (RenameToken *)0x0);
      }
    }
    pTVar6->tabFlags = pTVar6->tabFlags | autoInc << 3;
    pTVar6->iPKey = (i16)uVar12;
    pTVar6->keyConf = (u8)onError;
    if (pList != (ExprList *)0x0) {
      pParse->iPkSortOrder = pList->a[0].fg.sortFlags;
    }
    sqlite3HasExplicitNulls(pParse,pList);
  }
  else if (autoInc == 0) {
    sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,(Token *)0x0,
                       (Expr *)0x0,sortOrder,0,'\x02');
    pList = (ExprList *)0x0;
  }
  else {
    sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
  }
LAB_00173c07:
  if (pList == (ExprList *)0x0) {
    return;
  }
  exprListDeleteNN(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse,
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    makeColumnPartOfPrimaryKey(pParse, pCol);
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName;
        assert( !ExprHasProperty(pCExpr, EP_IntValue) );
        zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zCnName)==0 ){
            pCol = &pTab->aCol[iCol];
            makeColumnPartOfPrimaryKey(pParse, pCol);
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && pCol->eCType==COLTYPE_INTEGER
   && sortOrder!=SQLITE_SO_DESC
  ){
    if( IN_RENAME_OBJECT && pList ){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[0].pExpr);
      sqlite3RenameTokenRemap(pParse, &pTab->iPKey, pCExpr);
    }
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].fg.sortFlags;
    (void)sqlite3HasExplicitNulls(pParse, pList);
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}